

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test_run(test_table *table)

{
  uint64_t result;
  uint64_t local_18;
  
  (*ne_core_on_exit)((uint64_t *)0x0,test_on_exit,table);
  table->success = '\x01';
  table->is_final_run = '\0';
  local_18 = 0;
  table->result = &local_18;
  test_all(table);
  table->is_final_run = '\x01';
  table->result = (uint64_t *)0x0;
  test_all(table);
  return;
}

Assistant:

void test_run(test_table *table)
{
  // We register exit callbacks here since the callbacks are executed in LIFO
  // order and we want the library to have a change to register it's own exit
  // callbacks that will be called before the test exit.
  ne_core_on_exit(nullptr, &test_on_exit, table);

  table->success = NE_CORE_TRUE;
  table->is_final_run = NE_CORE_FALSE;
  uint64_t result = NE_CORE_RESULT_INVALID;
  table->result = &result;

  // Test everything with a valid result pointer.
  test_all(table);

  // Test everything with a null result pointer.
  table->is_final_run = NE_CORE_TRUE;
  table->result = nullptr;
  test_all(table);

  // Because of events, the test may continue well past this point so we can't
  // return a success or failure here.
}